

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers_test.cpp
# Opt level: O3

void __thiscall Array2D_Bounds_Test::TestBody(Array2D_Bounds_Test *this)

{
  bool bVar1;
  int iVar2;
  Allocator allocator;
  ulong uVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  int iVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  AssertionResult gtest_ar;
  Bounds2i b;
  Array2D<pbrt::Point2<float>_> a;
  undefined8 local_88;
  AssertHelper local_80;
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  Bounds2i local_68;
  int local_54;
  Array2D<pbrt::Point2<float>_> local_50;
  
  local_68.pMin.super_Tuple2<pbrt::Point2,_int>.x = -4;
  local_68.pMin.super_Tuple2<pbrt::Point2,_int>.y = 3;
  local_68.pMax.super_Tuple2<pbrt::Point2,_int>.x = 10;
  local_68.pMax.super_Tuple2<pbrt::Point2,_int>.y = 7;
  allocator.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Array2D<pbrt::Point2<float>_>::Array2D(&local_50,&local_68,allocator);
  local_88._0_4_ =
       (float)(local_68.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_68.pMin.super_Tuple2<pbrt::Point2,_int>.x);
  local_80.data_._0_4_ =
       local_50.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
       local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  testing::internal::CmpHelperEQ<int,int>
            (local_78,"b.pMax.x - b.pMin.x","a.xSize()",(int *)&local_88,(int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers_test.cpp"
               ,0x25,pcVar8);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (((CONCAT44(local_88._4_4_,(float)local_88) != 0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((long *)CONCAT44(local_88._4_4_,(float)local_88) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_88._4_4_,(float)local_88) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88._0_4_ =
       (float)(local_68.pMax.super_Tuple2<pbrt::Point2,_int>.y -
              local_68.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  local_80.data_._0_4_ =
       local_50.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
       local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  testing::internal::CmpHelperEQ<int,int>
            (local_78,"b.pMax.y - b.pMin.y","a.ySize()",(int *)&local_88,(int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers_test.cpp"
               ,0x26,pcVar8);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (((CONCAT44(local_88._4_4_,(float)local_88) != 0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((long *)CONCAT44(local_88._4_4_,(float)local_88) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_88._4_4_,(float)local_88) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar9 = local_68.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  uVar3 = (ulong)local_68.pMin.super_Tuple2<pbrt::Point2,_int> >> 0x20;
  iVar2 = local_68.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  iVar10 = local_68.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  if (local_68.pMax.super_Tuple2<pbrt::Point2,_int>.y <= iVar2) {
    iVar10 = iVar2;
  }
  if (iVar2 < local_68.pMax.super_Tuple2<pbrt::Point2,_int>.y &&
      iVar9 < local_68.pMax.super_Tuple2<pbrt::Point2,_int>.x) {
    TVar4 = local_68.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
    TVar6 = local_68.pMin.super_Tuple2<pbrt::Point2,_int>;
    do {
      iVar5 = TVar4.x;
      iVar7 = (local_50.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
              ((int)uVar3 - local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
              (iVar5 - local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
      local_50.values[iVar7].super_Tuple2<pbrt::Point2,_float>.x = (float)(int)uVar3;
      local_50.values[iVar7].super_Tuple2<pbrt::Point2,_float>.y = (float)iVar5;
      TVar4 = (Tuple2<pbrt::Point2,_int>)
              (((ulong)TVar6 & 0xffffffff00000000) + 0x100000000 |
              (ulong)local_68.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff);
      if (iVar5 + 1U != local_68.pMax.super_Tuple2<pbrt::Point2,_int>.x) {
        TVar4 = (Tuple2<pbrt::Point2,_int>)((ulong)TVar6 & 0xffffffff00000000 | (ulong)(iVar5 + 1U))
        ;
      }
      uVar3 = (ulong)TVar4 >> 0x20;
      TVar6 = TVar4;
    } while ((iVar9 != TVar4.x) || (iVar10 != TVar4.y));
  }
  uVar3 = (ulong)local_68.pMin.super_Tuple2<pbrt::Point2,_int> >> 0x20;
  local_54 = local_68.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  if (local_68.pMax.super_Tuple2<pbrt::Point2,_int>.y < iVar2) {
    local_54 = iVar2;
  }
  if ((iVar9 < local_68.pMax.super_Tuple2<pbrt::Point2,_int>.x) &&
     (iVar2 < local_68.pMax.super_Tuple2<pbrt::Point2,_int>.y)) {
    TVar4 = local_68.pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar6 = local_68.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
    do {
      local_88._0_4_ = (float)(int)uVar3;
      iVar10 = TVar6.x;
      local_88._4_4_ = (float)iVar10;
      testing::internal::CmpHelperEQ<pbrt::Point2<float>,pbrt::Point2<float>>
                (local_78,"Point2f(p.y, p.x)","a[p]",(Point2<float> *)&local_88,
                 local_50.values +
                 ((local_50.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                  local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
                  ((int)uVar3 - local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
                 (iVar10 - local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x)));
      if (local_78[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_88);
        pcVar8 = "";
        if (local_70.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = ((local_70.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers_test.cpp"
                   ,0x2c,pcVar8);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (((CONCAT44(local_88._4_4_,(float)local_88) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(local_88._4_4_,(float)local_88) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_88._4_4_,(float)local_88) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar3 = (ulong)TVar4 & 0xffffffff00000000;
      TVar4 = (Tuple2<pbrt::Point2,_int>)
              (uVar3 + 0x100000000 |
              (ulong)local_68.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff);
      if (iVar10 + 1U != local_68.pMax.super_Tuple2<pbrt::Point2,_int>.x) {
        TVar4 = (Tuple2<pbrt::Point2,_int>)(uVar3 | iVar10 + 1U);
      }
      uVar3 = (ulong)TVar4 >> 0x20;
      TVar6 = TVar4;
    } while ((iVar9 != TVar4.x) || (local_54 != TVar4.y));
  }
  pbrt::Array2D<pbrt::Point2<float>_>::~Array2D(&local_50);
  return;
}

Assistant:

TEST(Array2D, Bounds) {
    Bounds2i b(Point2i(-4, 3), Point2i(10, 7));
    Array2D<Point2f> a(b);

    EXPECT_EQ(b.pMax.x - b.pMin.x, a.xSize());
    EXPECT_EQ(b.pMax.y - b.pMin.y, a.ySize());

    for (Point2i p : b)
        a[p] = Point2f(p.y, p.x);

    for (Point2i p : b)
        EXPECT_EQ(Point2f(p.y, p.x), a[p]);
}